

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::
write<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeDef,winmd::reader::TypeDef,std::basic_string_view<char,std::char_traits<char>>>
          (writer_base<cppwinrt::writer> *this,string_view *value,
          basic_string_view<char,_std::char_traits<char>_> *args,TypeDef *args_1,TypeDef *args_2,
          basic_string_view<char,_std::char_traits<char>_> *args_3)

{
  basic_string_view<char,_std::char_traits<char>_> *args_local_3;
  TypeDef *args_local_2;
  TypeDef *args_local_1;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  string_view *value_local;
  writer_base<cppwinrt::writer> *this_local;
  
  write_segment<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeDef,winmd::reader::TypeDef,std::basic_string_view<char,std::char_traits<char>>>
            (this,value,args,args_1,args_2,args_3);
  return;
}

Assistant:

void write(std::string_view const& value, Args const&... args)
        {
#if defined(_DEBUG)
            auto expected = count_placeholders(value);
            auto actual = sizeof...(Args);
            assert(expected == actual);
#endif
            write_segment(value, args...);
        }